

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::languageCodeList(GrpParser *this)

{
  ASTFactory *pAVar1;
  int iVar2;
  NoViableAltException *this_00;
  RefAST *this_01;
  RefAST tmp177_AST;
  RefAST tmp174_AST;
  RefAST tmp176_AST;
  RefAST tmp172_AST;
  ASTPair currentAST;
  RefAST languageCodeList_AST;
  undefined1 local_d8 [16];
  RefAST *local_c8;
  GrpParser *local_c0;
  ASTFactory local_b8;
  ASTPair local_a8;
  RefCount<AST> local_98;
  RefCount<Token> local_90;
  RefCount<AST> local_88;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefCount<Token> local_70;
  RefToken local_68;
  RefAST local_60;
  RefAST local_58;
  RefAST local_50;
  RefCount<Token> local_48;
  ASTFactory local_40;
  
  this_01 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_01,&nullAST);
  local_98.ref = nullAST.ref;
  local_a8.root.ref = (Ref *)0x0;
  local_a8.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_98.ref = (Ref *)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  local_b8.nodeFactory = (factory_type)nullAST;
  local_c0 = this;
  if (iVar2 == 6) {
    if (nullAST.ref == (Ref *)0x0) {
      local_b8.nodeFactory = (factory_type)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    ASTFactory::create((ASTFactory *)(local_d8 + 8),(RefToken *)pAVar1);
    RefCount<AST>::operator=((RefCount<AST> *)&local_b8.nodeFactory,(RefCount<AST> *)(local_d8 + 8))
    ;
    RefCount<AST>::~RefCount((RefCount<AST> *)(local_d8 + 8));
    RefCount<Token>::~RefCount(&local_78);
    Parser::match((Parser *)this,6);
    local_d8._8_8_ = nullAST;
    if (nullAST.ref == (Ref *)0x0) {
      local_d8._8_8_ = (Ref *)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
    ASTFactory::create((ASTFactory *)local_d8,(RefToken *)pAVar1);
    RefCount<AST>::operator=((RefCount<AST> *)(local_d8 + 8),(RefCount<AST> *)local_d8);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_d8);
    RefCount<Token>::~RefCount(&local_80);
    if ((Ref *)local_d8._8_8_ == (Ref *)0x0) {
      local_58.ref = (Ref *)0x0;
    }
    else {
      *(uint *)(local_d8._8_8_ + 8) = *(uint *)(local_d8._8_8_ + 8) + 1;
      local_58.ref = (Ref *)local_d8._8_8_;
    }
    ASTFactory::addASTChild(pAVar1,&local_a8,&local_58);
    local_c8 = this_01;
    RefCount<AST>::~RefCount(&local_58);
    Parser::match((Parser *)this,0x14);
    while( true ) {
      iVar2 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      this_01 = local_c8;
      local_d8._0_8_ = nullAST;
      if (iVar2 != 0x15) break;
      if (nullAST.ref == (Ref *)0x0) {
        local_d8._0_8_ = (Ref *)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_40.nodeFactory,this,1);
      ASTFactory::create(&local_b8,(RefToken *)pAVar1);
      RefCount<AST>::operator=((RefCount<AST> *)local_d8,(RefCount<AST> *)&local_b8);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_b8);
      RefCount<Token>::~RefCount((RefCount<Token> *)&local_40.nodeFactory);
      Parser::match((Parser *)this,0x15);
      local_b8._vptr_ASTFactory = (_func_int **)nullAST;
      if (nullAST.ref == (Ref *)0x0) {
        local_b8._vptr_ASTFactory = (_func_int **)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
      ASTFactory::create(&local_40,(RefToken *)pAVar1);
      RefCount<AST>::operator=((RefCount<AST> *)&local_b8,(RefCount<AST> *)&local_40);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_40);
      RefCount<Token>::~RefCount(&local_48);
      if ((Ref *)local_b8._vptr_ASTFactory == (Ref *)0x0) {
        local_88.ref = (Ref *)0x0;
      }
      else {
        *(uint *)((long)local_b8._vptr_ASTFactory + 8) =
             *(uint *)((long)local_b8._vptr_ASTFactory + 8) + 1;
        local_88.ref = (Ref *)local_b8._vptr_ASTFactory;
      }
      ASTFactory::addASTChild(pAVar1,&local_a8,&local_88);
      RefCount<AST>::~RefCount(&local_88);
      this = local_c0;
      Parser::match((Parser *)local_c0,0x14);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_b8);
      RefCount<AST>::~RefCount((RefCount<AST> *)local_d8);
    }
    if (nullAST.ref == (Ref *)0x0) {
      local_d8._0_8_ = (Ref *)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90,this,1);
    ASTFactory::create(&local_b8,(RefToken *)pAVar1);
    RefCount<AST>::operator=((RefCount<AST> *)local_d8,(RefCount<AST> *)&local_b8);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_b8);
    RefCount<Token>::~RefCount(&local_90);
    if ((Ref *)local_d8._0_8_ == (Ref *)0x0) {
      local_60.ref = (Ref *)0x0;
    }
    else {
      *(uint *)(local_d8._0_8_ + 8) = *(uint *)(local_d8._0_8_ + 8) + 1;
      local_60.ref = (Ref *)local_d8._0_8_;
    }
    ASTFactory::addASTChild(pAVar1,&local_a8,&local_60);
    RefCount<AST>::~RefCount(&local_60);
    Parser::match((Parser *)this,7);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_d8);
    RefCount<AST>::~RefCount((RefCount<AST> *)(local_d8 + 8));
  }
  else {
    if (iVar2 != 0x14) {
      this_00 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_68,this,1);
      NoViableAltException::NoViableAltException(this_00,&local_68);
      __cxa_throw(this_00,&NoViableAltException::typeinfo,
                  NoViableAltException::~NoViableAltException);
    }
    if (nullAST.ref == (Ref *)0x0) {
      local_b8.nodeFactory = (factory_type)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_70,this,1);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    ASTFactory::create((ASTFactory *)(local_d8 + 8),(RefToken *)pAVar1);
    RefCount<AST>::operator=((RefCount<AST> *)&local_b8.nodeFactory,(RefCount<AST> *)(local_d8 + 8))
    ;
    RefCount<AST>::~RefCount((RefCount<AST> *)(local_d8 + 8));
    RefCount<Token>::~RefCount(&local_70);
    if ((Ref *)local_b8.nodeFactory == (Ref *)0x0) {
      local_50.ref = (Ref *)0x0;
    }
    else {
      *(uint *)((long)local_b8.nodeFactory + 8) = *(uint *)((long)local_b8.nodeFactory + 8) + 1;
      local_50.ref = (Ref *)local_b8.nodeFactory;
    }
    ASTFactory::addASTChild(pAVar1,&local_a8,&local_50);
    RefCount<AST>::~RefCount(&local_50);
    Parser::match((Parser *)this,0x14);
  }
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_b8.nodeFactory);
  RefCount<AST>::operator=(&local_98,&local_a8.root);
  RefCount<AST>::operator=(this_01,&local_98);
  RefCount<AST>::~RefCount(&local_98);
  RefCount<AST>::~RefCount(&local_a8.child);
  RefCount<AST>::~RefCount(&local_a8.root);
  return;
}

Assistant:

void GrpParser::languageCodeList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST languageCodeList_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case LIT_STRING:
		{
			RefAST tmp172_AST = nullAST;
			tmp172_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp172_AST);
			match(LIT_STRING);
			break;
		}
		case OP_LPAREN:
		{
			RefAST tmp173_AST = nullAST;
			tmp173_AST = astFactory.create(LT(1));
			match(OP_LPAREN);
			RefAST tmp174_AST = nullAST;
			tmp174_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp174_AST);
			match(LIT_STRING);
			{
			do {
				if ((LA(1)==OP_COMMA)) {
					RefAST tmp175_AST = nullAST;
					tmp175_AST = astFactory.create(LT(1));
					match(OP_COMMA);
					RefAST tmp176_AST = nullAST;
					tmp176_AST = astFactory.create(LT(1));
					astFactory.addASTChild(currentAST, tmp176_AST);
					match(LIT_STRING);
				}
				else {
					goto _loop182;
				}
				
			} while (true);
			_loop182:;
			}
			RefAST tmp177_AST = nullAST;
			tmp177_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp177_AST);
			match(OP_RPAREN);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		languageCodeList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_45);
	}
	returnAST = languageCodeList_AST;
}